

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b8580;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b81d8);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b7ed8;
  *(undefined4 *)(this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes = 0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 4) =
       0xffffffff;
  *(undefined4 *)((this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 1) =
       0xffffffff;
  *(undefined4 *)((long)(this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes + 0xc) =
       0xffffffff;
  (this->fGeo).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoLinear_016c2718;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}